

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O3

void __thiscall net_uv::KCPServer::executeOperation(KCPServer *this)

{
  Mutex *mutex;
  queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
  *this_00;
  iterator *piVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  uint uVar4;
  void *pvVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  int iVar8;
  _Elt_pointer pSVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  SessionOperation *__args;
  iterator __position;
  bool bVar13;
  
  mutex = &(this->super_Server).super_SessionManager.m_operationMutex;
  iVar8 = uv_mutex_trylock(&mutex->m_uv_mutext);
  if (iVar8 == 0) {
    __args = (this->super_Server).super_SessionManager.m_operationQue.c.
             super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->super_Server).super_SessionManager.m_operationQue.c.
        super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == __args) {
      uv_mutex_unlock(&mutex->m_uv_mutext);
      return;
    }
    this_00 = &(this->super_Server).super_SessionManager.m_operationDispatchQue;
    do {
      pSVar9 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
               super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar9 == (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                    super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<net_uv::SessionManager::SessionOperation,std::allocator<net_uv::SessionManager::SessionOperation>>
        ::_M_push_back_aux<net_uv::SessionManager::SessionOperation_const&>
                  ((deque<net_uv::SessionManager::SessionOperation,std::allocator<net_uv::SessionManager::SessionOperation>>
                    *)this_00,__args);
      }
      else {
        uVar6 = __args->sessionID;
        pSVar9->operationDataLen = __args->operationDataLen;
        pSVar9->sessionID = uVar6;
        uVar7 = *(undefined4 *)&__args->field_0x4;
        pvVar5 = __args->operationData;
        pSVar9->operationType = __args->operationType;
        *(undefined4 *)&pSVar9->field_0x4 = uVar7;
        pSVar9->operationData = pvVar5;
        piVar1 = &(this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                  super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::
      deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
      ::pop_front(&(this->super_Server).super_SessionManager.m_operationQue.c);
      __args = (this->super_Server).super_SessionManager.m_operationQue.c.
               super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->super_Server).super_SessionManager.m_operationQue.c.
             super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != __args);
    uv_mutex_unlock(&mutex->m_uv_mutext);
    pSVar9 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
             super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->super_Server).super_SessionManager.m_operationDispatchQue.c.
        super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar9) {
      p_Var2 = &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header;
      do {
        switch(pSVar9->operationType) {
        case 0:
          for (p_Var10 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var10 != p_Var2;
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            if (*(char *)&p_Var10[1]._M_left == '\0') {
              (**(code **)(*(long *)p_Var10[1]._M_parent + 0x48))();
            }
          }
          (*(this->m_server->super_Socket)._vptr_Socket[7])();
          (this->super_Server).m_serverStage = WAIT_CLOSE_SERVER_SOCKET;
          Runnable::stopTimerUpdate((Runnable *)this);
          break;
        case 1:
          p_Var12 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 != (_Base_ptr)0x0) {
            uVar4 = pSVar9->sessionID;
            p_Var11 = &p_Var2->_M_header;
            do {
              bVar13 = (uint)*(size_t *)(p_Var12 + 1) < uVar4;
              if (!bVar13) {
                p_Var11 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[bVar13];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
               ((uint)((_Rb_tree_header *)p_Var11)->_M_node_count <= uVar4)) {
              (**(code **)(**(long **)((long)p_Var11 + 0x28) + 0x38))
                        (*(long **)((long)p_Var11 + 0x28),pSVar9->operationData,
                         pSVar9->operationDataLen);
              break;
            }
          }
          goto LAB_00142d1f;
        case 2:
          p_Var12 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 != (_Base_ptr)0x0) {
            uVar4 = pSVar9->sessionID;
            p_Var11 = &p_Var2->_M_header;
            do {
              bVar13 = (uint)*(size_t *)(p_Var12 + 1) < uVar4;
              if (!bVar13) {
                p_Var11 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[bVar13];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
               ((uint)((_Rb_tree_header *)p_Var11)->_M_node_count <= uVar4)) {
              (**(code **)(**(long **)((long)p_Var11 + 0x28) + 0x40))
                        (*(long **)((long)p_Var11 + 0x28),pSVar9->operationData,
                         pSVar9->operationDataLen);
              break;
            }
          }
LAB_00142d1f:
          free(pSVar9->operationData);
          break;
        case 3:
          p_Var12 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 != (_Base_ptr)0x0) {
            uVar4 = pSVar9->sessionID;
            p_Var11 = &p_Var2->_M_header;
            do {
              bVar13 = (uint)*(size_t *)(p_Var12 + 1) < uVar4;
              if (!bVar13) {
                p_Var11 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[bVar13];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
               ((uint)((_Rb_tree_header *)p_Var11)->_M_node_count <= uVar4)) {
              (**(code **)(**(long **)((long)p_Var11 + 0x28) + 0x48))();
            }
          }
          break;
        case 4:
          p_Var12 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 != (_Base_ptr)0x0) {
            _Var3 = pSVar9->sessionID;
            __position._M_node = &p_Var2->_M_header;
            do {
              bVar13 = p_Var12[1]._M_color < _Var3;
              if (!bVar13) {
                __position._M_node = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[bVar13];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)__position._M_node != p_Var2) &&
               (__position._M_node[1]._M_color <= _Var3)) {
              (*(code *)**(undefined8 **)__position._M_node[1]._M_parent)();
              free(__position._M_node[1]._M_parent);
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
                                  *)&this->m_allSession,__position);
            }
          }
        }
        std::
        deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
        ::pop_front(&this_00->c);
        pSVar9 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                 super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while ((this->super_Server).super_SessionManager.m_operationDispatchQue.c.
               super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar9);
    }
  }
  return;
}

Assistant:

void KCPServer::executeOperation()
{
	if (m_operationMutex.trylock() != 0)
	{
		return;
	}

	if (m_operationQue.empty())
	{
		m_operationMutex.unlock();
		return;
	}

	while (!m_operationQue.empty())
	{
		m_operationDispatchQue.push(m_operationQue.front());
		m_operationQue.pop();
	}
	m_operationMutex.unlock();

	while (!m_operationDispatchQue.empty())
	{
		auto & curOperation = m_operationDispatchQue.front();
		switch (curOperation.operationType)
		{
		case KCP_SVR_OP_SEND_DATA:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSend((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_SEND_CLOSE:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSendAndClose((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_DIS_SESSION:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeDisconnect();
			}
		}break;
		case KCP_SVR_OP_SEND_DIS_SESSION_MSG_TO_MAIN_THREAD:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->~KCPSession();
				fc_free(it->second.session);
				it = m_allSession.erase(it);
			}
		}break;
		case KCP_SVR_OP_STOP_SERVER:
		{
			for (auto & it : m_allSession)
			{
				if (!it.second.isInvalid)
				{
					it.second.session->executeDisconnect();
				}
			}
			m_server->disconnect();
			m_serverStage = ServerStage::WAIT_CLOSE_SERVER_SOCKET;

			stopTimerUpdate();
		}break;
		default:
			break;
		}
		m_operationDispatchQue.pop();
	}
}